

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_objectwriter.cc
# Opt level: O2

JsonObjectWriter * __thiscall
google::protobuf::util::converter::JsonObjectWriter::RenderFloat
          (JsonObjectWriter *this,StringPiece name,float value)

{
  int iVar1;
  stringpiece_ssize_type sVar2;
  undefined4 extraout_var;
  JsonObjectWriter *pJVar3;
  protobuf *this_00;
  StringPiece value_00;
  string local_50;
  
  this_00 = (protobuf *)name.ptr_;
  if ((uint)ABS(value) < 0x7f800000) {
    SimpleFtoa_abi_cxx11_(&local_50,this_00,value);
    sVar2 = StringPiece::CheckedSsizeTFromSizeT(local_50._M_string_length);
    value_00.length_ = sVar2;
    value_00.ptr_ = local_50._M_dataplus._M_p;
    pJVar3 = RenderSimple(this,name,value_00);
  }
  else {
    FloatAsString_abi_cxx11_(&local_50,(converter *)this_00,value);
    sVar2 = StringPiece::CheckedSsizeTFromSizeT(local_50._M_string_length);
    iVar1 = (*(this->super_StructuredObjectWriter).super_ObjectWriter._vptr_ObjectWriter[0xd])
                      (this,this_00,name.length_,local_50._M_dataplus._M_p,sVar2);
    pJVar3 = (JsonObjectWriter *)CONCAT44(extraout_var,iVar1);
  }
  std::__cxx11::string::~string((string *)&local_50);
  return pJVar3;
}

Assistant:

JsonObjectWriter* JsonObjectWriter::RenderFloat(StringPiece name,
                                                float value) {
  if (std::isfinite(value)) {
    return RenderSimple(name, SimpleFtoa(value));
  }

  // Render quoted with NaN/Infinity-aware FloatAsString.
  return RenderString(name, FloatAsString(value));
}